

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O3

bool __thiscall
QNativeSocketEnginePrivate::checkProxy(QNativeSocketEnginePrivate *this,QHostAddress *address)

{
  QNetworkProxy QVar1;
  bool bVar2;
  SocketType SVar3;
  ProxyType PVar4;
  QAbstractSocket *this_00;
  long lVar5;
  bool bVar6;
  QueryType type;
  long in_FS_OFFSET;
  QNetworkProxyQuery query;
  QNetworkProxy proxy;
  QArrayDataPointer<QNetworkProxy> local_58;
  QNetworkProxyQuery local_40;
  QNetworkProxy local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHostAddress::isLoopback(address);
  bVar6 = true;
  if (bVar2) goto LAB_001c51b9;
  local_38.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxy::QNetworkProxy(&local_38);
  this_00 = (QAbstractSocket *)QMetaObject::cast((QObject *)&QAbstractSocket::staticMetaObject);
  if (this_00 == (QAbstractSocket *)0x0) {
    lVar5 = QMetaObject::cast((QObject *)&QTcpServer::staticMetaObject);
    if (lVar5 != 0) {
      QTcpServer::proxy((QTcpServer *)&local_58);
      QVar1.d.d.ptr = local_38.d.d.ptr;
      local_38.d.d.ptr =
           (QSharedDataPointer<QNetworkProxyPrivate>)
           (QSharedDataPointer<QNetworkProxyPrivate>)local_58.d;
      local_58.d = (Data *)QVar1.d.d.ptr;
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
      type = TcpServer;
      goto LAB_001c5122;
    }
    bVar6 = true;
  }
  else {
    QAbstractSocket::proxy((QAbstractSocket *)&local_58);
    QVar1.d.d.ptr = local_38.d.d.ptr;
    local_38.d.d.ptr =
         (QSharedDataPointer<QNetworkProxyPrivate>)
         (QSharedDataPointer<QNetworkProxyPrivate>)local_58.d;
    local_58.d = (Data *)QVar1.d.d.ptr;
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
    SVar3 = QAbstractSocket::socketType(this_00);
    type = (uint)(SVar3 == SctpSocket) * 2;
    if (SVar3 == UdpSocket) {
      type = UdpSocket;
    }
LAB_001c5122:
    PVar4 = QNetworkProxy::type(&local_38);
    if (PVar4 == DefaultProxy) {
      local_40.d.d.ptr = (QSharedDataPointer<QNetworkProxyQueryPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkProxyQuery::QNetworkProxyQuery(&local_40);
      QNetworkProxyQuery::setQueryType(&local_40,type);
      QNetworkProxyFactory::proxyForQuery((QList<QNetworkProxy> *)&local_58,&local_40);
      QNetworkProxy::operator=(&local_38,local_58.ptr);
      QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_58);
      QNetworkProxyQuery::~QNetworkProxyQuery(&local_40);
    }
    PVar4 = QNetworkProxy::type(&local_38);
    bVar6 = true;
    if ((PVar4 != DefaultProxy) && (PVar4 = QNetworkProxy::type(&local_38), PVar4 != NoProxy)) {
      setError(this,UnsupportedSocketOperationError,InvalidProxyTypeString);
      bVar6 = false;
    }
  }
  QNetworkProxy::~QNetworkProxy(&local_38);
LAB_001c51b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QNativeSocketEnginePrivate::checkProxy(const QHostAddress &address)
{
    if (address.isLoopback())
        return true;

#if !defined(QT_NO_NETWORKPROXY)
    QObject *parent = q_func()->parent();
    QNetworkProxy proxy;
    QNetworkProxyQuery::QueryType queryType = QNetworkProxyQuery::TcpSocket;
    if (QAbstractSocket *socket = qobject_cast<QAbstractSocket *>(parent)) {
        proxy = socket->proxy();
        switch (socket->socketType()) {
        case QAbstractSocket::UdpSocket:
            queryType = QNetworkProxyQuery::UdpSocket;
            break;
        case QAbstractSocket::SctpSocket:
            queryType = QNetworkProxyQuery::SctpSocket;
            break;
        case QAbstractSocket::TcpSocket:
        case QAbstractSocket::UnknownSocketType:
            queryType = QNetworkProxyQuery::TcpSocket;
        }
    } else if (QTcpServer *server = qobject_cast<QTcpServer *>(parent)) {
        proxy = server->proxy();
        queryType = QNetworkProxyQuery::TcpServer;
#ifndef QT_NO_SCTP
        if (qobject_cast<QSctpServer *>(server))
            queryType = QNetworkProxyQuery::SctpServer;
#endif
    } else {
        // no parent -> no proxy
        return true;
    }

    if (proxy.type() == QNetworkProxy::DefaultProxy) {
        // This is similar to what we have in QNetworkProxy::applicationProxy,
        // the only difference is that we provide the correct query type instead of
        // always using TcpSocket unconditionally (this is the default type for
        // QNetworkProxyQuery).
        QNetworkProxyQuery query;
        query.setQueryType(queryType);
        proxy = QNetworkProxyFactory::proxyForQuery(query).constFirst();
    }

    if (proxy.type() != QNetworkProxy::DefaultProxy &&
        proxy.type() != QNetworkProxy::NoProxy) {
        // QNativeSocketEngine doesn't do proxies
        setError(QAbstractSocket::UnsupportedSocketOperationError,
                 QNativeSocketEnginePrivate::InvalidProxyTypeString);
        return false;
    }
#endif

    return true;
}